

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

void __thiscall
spirv_cross::SmallVector<spirv_cross::SpecializationConstant,_8UL>::reserve
          (SmallVector<spirv_cross::SpecializationConstant,_8UL> *this,size_t count)

{
  size_t i;
  ulong uVar1;
  SpecializationConstant *pSVar2;
  ulong uVar3;
  SpecializationConstant *__ptr;
  
  if (count >> 0x3d == 0) {
    uVar1 = this->buffer_capacity;
    if (uVar1 < count) {
      uVar3 = 8;
      if (8 < uVar1) {
        uVar3 = uVar1;
      }
      do {
        uVar1 = uVar3;
        uVar3 = uVar1 * 2;
      } while (uVar1 < count);
      if (uVar1 < 9) {
        pSVar2 = (SpecializationConstant *)&this->stack_storage;
      }
      else {
        pSVar2 = (SpecializationConstant *)malloc(uVar1 * 8);
        if (pSVar2 == (SpecializationConstant *)0x0) goto LAB_002f0565;
      }
      __ptr = (this->super_VectorView<spirv_cross::SpecializationConstant>).ptr;
      if (pSVar2 != __ptr) {
        for (uVar3 = 0;
            uVar3 < (this->super_VectorView<spirv_cross::SpecializationConstant>).buffer_size;
            uVar3 = uVar3 + 1) {
          pSVar2[uVar3] = (this->super_VectorView<spirv_cross::SpecializationConstant>).ptr[uVar3];
        }
        __ptr = (this->super_VectorView<spirv_cross::SpecializationConstant>).ptr;
      }
      if (__ptr != (SpecializationConstant *)&this->stack_storage) {
        free(__ptr);
      }
      (this->super_VectorView<spirv_cross::SpecializationConstant>).ptr = pSVar2;
      this->buffer_capacity = uVar1;
    }
    return;
  }
LAB_002f0565:
  ::std::terminate();
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > std::numeric_limits<size_t>::max() / sizeof(T)) ||
		    (count > std::numeric_limits<size_t>::max() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}